

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_script.cpp
# Opt level: O1

bool __thiscall cfd::core::Script::IsPegoutScript(Script *this)

{
  ScriptElementType SVar1;
  pointer pSVar2;
  ulong uVar3;
  size_t sVar4;
  ScriptElementType *pSVar5;
  ulong uVar6;
  ulong uVar7;
  bool bVar8;
  ByteData local_30;
  
  sVar4 = ByteData::GetDataSize(&this->script_data_);
  if ((1 < sVar4) &&
     (pSVar2 = (this->script_stack_).
               super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
               ._M_impl.super__Vector_impl_data._M_start,
     (pSVar2->op_code_).data_type_ == ScriptOperator::OP_RETURN._8_4_)) {
    bVar8 = true;
    if (pSVar2[1].type_ == kElementBinary) {
      ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                (&local_30.data_,&pSVar2[1].binary_data_.data_);
      sVar4 = ByteData::GetDataSize(&local_30);
      bVar8 = sVar4 != 0x20;
      if (local_30.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_30.data_.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
    }
    if (!bVar8) {
      pSVar2 = (this->script_stack_).
               super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
               ._M_impl.super__Vector_impl_data._M_start;
      uVar6 = ((long)(this->script_stack_).
                     super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
                     ._M_impl.super__Vector_impl_data._M_finish - (long)pSVar2 >> 5) *
              -0x5555555555555555;
      bVar8 = uVar6 < 3;
      if (bVar8) {
        return bVar8;
      }
      if (pSVar2[2].type_ != kElementBinary) {
        return bVar8;
      }
      pSVar5 = &pSVar2[3].type_;
      uVar3 = 3;
      do {
        uVar7 = uVar3;
        if (uVar6 - uVar7 == 0) break;
        SVar1 = *pSVar5;
        pSVar5 = pSVar5 + 0x18;
        uVar3 = uVar7 + 1;
      } while (SVar1 == kElementBinary);
      return uVar6 <= uVar7;
    }
  }
  return false;
}

Assistant:

bool Script::IsPegoutScript() const {
  if ((script_data_.GetDataSize() < 2) ||
      (script_stack_[0].GetOpCode() != ScriptOperator::OP_RETURN)) {
    return false;
  }

  if (!script_stack_[1].IsBinary() ||
      script_stack_[1].GetBinaryData().GetDataSize() != kByteData256Length) {
    return false;
  }

  for (size_t i = 2; i < script_stack_.size(); ++i) {
    if (!script_stack_[i].IsBinary()) {
      return false;
    }
  }

  return true;
}